

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteTriggerStep(sqlite3 *db,TriggerStep *pTriggerStep)

{
  TriggerStep *pTVar1;
  TriggerStep *pTmp;
  TriggerStep *pTriggerStep_local;
  sqlite3 *db_local;
  
  pTmp = pTriggerStep;
  while (pTmp != (TriggerStep *)0x0) {
    pTVar1 = pTmp->pNext;
    sqlite3ExprDelete(db,pTmp->pWhere);
    sqlite3ExprListDelete(db,pTmp->pExprList);
    sqlite3SelectDelete(db,pTmp->pSelect);
    sqlite3IdListDelete(db,pTmp->pIdList);
    sqlite3UpsertDelete(db,pTmp->pUpsert);
    sqlite3DbFree(db,pTmp->zSpan);
    sqlite3DbFree(db,pTmp);
    pTmp = pTVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTriggerStep(sqlite3 *db, TriggerStep *pTriggerStep){
  while( pTriggerStep ){
    TriggerStep * pTmp = pTriggerStep;
    pTriggerStep = pTriggerStep->pNext;

    sqlite3ExprDelete(db, pTmp->pWhere);
    sqlite3ExprListDelete(db, pTmp->pExprList);
    sqlite3SelectDelete(db, pTmp->pSelect);
    sqlite3IdListDelete(db, pTmp->pIdList);
    sqlite3UpsertDelete(db, pTmp->pUpsert);
    sqlite3DbFree(db, pTmp->zSpan);

    sqlite3DbFree(db, pTmp);
  }
}